

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pullpush.c
# Opt level: O0

size_t pull_varlength(uchar **cursor,size_t *max)

{
  uint64_t len;
  size_t *max_local;
  uchar **cursor_local;
  
  cursor_local = (uchar **)pull_varint(cursor,max);
  if ((uchar **)*max < cursor_local) {
    pull_failed(cursor,max);
    cursor_local = (uchar **)0x0;
  }
  return (size_t)cursor_local;
}

Assistant:

size_t pull_varlength(const unsigned char **cursor, size_t *max)
{
    uint64_t len = pull_varint(cursor, max);

    if (len > *max) {
        /* Impossible length. */
        pull_failed(cursor, max);
        return 0;
    }
    return len;
}